

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_st.c
# Opt level: O0

err_t cmdStBelt(void)

{
  bool_t bVar1;
  octet buf1 [32];
  octet buf [48];
  octet state [1024];
  char pwd [17];
  void *in_stack_fffffffffffffaf8;
  octet *src;
  octet *in_stack_fffffffffffffb00;
  octet *hash;
  octet *in_stack_fffffffffffffb08;
  octet *poVar2;
  void *in_stack_fffffffffffffb10;
  octet *buf_00;
  octet *in_stack_fffffffffffffb18;
  void *in_stack_fffffffffffffb20;
  size_t in_stack_fffffffffffffb28;
  octet *in_stack_fffffffffffffb30;
  octet *in_stack_fffffffffffffb38;
  octet local_448 [48];
  octet local_418 [1024];
  undefined8 local_18;
  undefined8 local_10;
  undefined1 local_8;
  err_t local_4;
  
  local_18 = 0x3843414234393142;
  local_10 = 0x4233354638304130;
  local_8 = 0;
  beltH();
  memCopy(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,0x10ba9e);
  beltH();
  beltECBStart(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,(size_t)in_stack_fffffffffffffb00
              );
  beltECBStepE(in_stack_fffffffffffffb10,(size_t)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00
              );
  bVar1 = hexEq(in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
  if (bVar1 == 0) {
    local_4 = 0x20a;
  }
  else {
    beltH();
    memCopy(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,0x10bb44);
    beltH();
    beltECBStart(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                 (size_t)in_stack_fffffffffffffb00);
    beltECBStepD(in_stack_fffffffffffffb10,(size_t)in_stack_fffffffffffffb08,
                 in_stack_fffffffffffffb00);
    bVar1 = hexEq(in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
    if (bVar1 == 0) {
      local_4 = 0x20a;
    }
    else {
      beltH();
      beltH();
      beltMAC(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,(size_t)in_stack_fffffffffffffb08,
              in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8);
      bVar1 = hexEq(in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
      if (bVar1 == 0) {
        local_4 = 0x20a;
      }
      else {
        strLen((char *)0x10bc52);
        beltH();
        beltPBKDF2(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                   (size_t)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                   (size_t)in_stack_fffffffffffffb10);
        bVar1 = hexEq(in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
        if (bVar1 == 0) {
          local_4 = 0x20a;
        }
        else {
          beltH();
          beltH();
          beltCHEStart(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
                       (size_t)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
          beltH();
          memCopy(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,0x10bd1e);
          beltCHEStepE(in_stack_fffffffffffffb10,(size_t)in_stack_fffffffffffffb08,
                       in_stack_fffffffffffffb00);
          beltH();
          beltCHEStepI(in_stack_fffffffffffffb10,(size_t)in_stack_fffffffffffffb08,
                       in_stack_fffffffffffffb00);
          beltCHEStepA(in_stack_fffffffffffffb10,(size_t)in_stack_fffffffffffffb08,
                       in_stack_fffffffffffffb00);
          beltCHEStepG(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
          bVar1 = hexEq(in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
          if (bVar1 == 0) {
            local_4 = 0x20a;
          }
          else {
            bVar1 = hexEq(in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
            if (bVar1 == 0) {
              local_4 = 0x20a;
            }
            else {
              bVar1 = beltCHEStepV(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
              if (bVar1 == 0) {
                local_4 = 0x20a;
              }
              else {
                poVar2 = local_418;
                beltH();
                beltH();
                beltCHEStart(poVar2,in_stack_fffffffffffffb18,(size_t)in_stack_fffffffffffffb10,
                             in_stack_fffffffffffffb08);
                beltH();
                memCopy(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,0x10be79);
                beltH();
                beltCHEStepI(in_stack_fffffffffffffb10,(size_t)in_stack_fffffffffffffb08,
                             in_stack_fffffffffffffb00);
                beltCHEStepA(in_stack_fffffffffffffb10,(size_t)in_stack_fffffffffffffb08,
                             in_stack_fffffffffffffb00);
                beltCHEStepD(in_stack_fffffffffffffb00,(size_t)in_stack_fffffffffffffaf8,
                             (void *)0x10bed1);
                beltCHEStepG(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
                bVar1 = hexEq(in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
                if (bVar1 == 0) {
                  local_4 = 0x20a;
                }
                else {
                  bVar1 = hexEq(in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
                  if (bVar1 == 0) {
                    local_4 = 0x20a;
                  }
                  else {
                    poVar2 = local_418;
                    beltH();
                    beltWBLStart(in_stack_fffffffffffffb10,poVar2,(size_t)in_stack_fffffffffffffb00)
                    ;
                    buf_00 = local_448;
                    beltH();
                    memCopy(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,0x10bf8b);
                    beltH();
                    memCopy(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,0x10bfb9);
                    beltWBLStepE(buf_00,(size_t)poVar2,in_stack_fffffffffffffb00);
                    bVar1 = hexEq(buf_00,(char *)poVar2);
                    if (bVar1 == 0) {
                      local_4 = 0x20a;
                    }
                    else {
                      src = local_418;
                      beltH();
                      beltWBLStart(buf_00,poVar2,(size_t)in_stack_fffffffffffffb00);
                      hash = local_448;
                      beltH();
                      memCopy(hash,src,0x10c055);
                      beltWBLStepD(hash,(size_t)src,(void *)0x10c06f);
                      bVar1 = hexEq(buf_00,(char *)poVar2);
                      if (bVar1 == 0) {
                        local_4 = 0x20a;
                      }
                      else {
                        bVar1 = hexEq(buf_00,(char *)poVar2);
                        if (bVar1 == 0) {
                          local_4 = 0x20a;
                        }
                        else {
                          beltHashStart(hash);
                          beltH();
                          beltHashStepH(buf_00,(size_t)poVar2,hash);
                          beltHashStepG(hash,src);
                          bVar1 = hexEq(buf_00,(char *)poVar2);
                          if (bVar1 == 0) {
                            local_4 = 0x20a;
                          }
                          else {
                            local_4 = 0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static err_t cmdStBelt()
{
	const char pwd[] = "B194BAC80A08F53B";
	octet state[1024];
	octet buf[48];
	octet buf1[32];
	// belt-ecb: тест A.9-1
	ASSERT(sizeof(state) >= beltECB_keep());
	memCopy(buf, beltH(), 48);
	beltECBStart(state, beltH() + 128, 32);
	beltECBStepE(buf, 16, state);
	if (!hexEq(buf,
		"69CCA1C93557C9E3D66BC3E0FA88FA6E"))
		return ERR_SELFTEST;
	// belt-ecb: тест A.10-1
	memCopy(buf, beltH() + 64, 48);
	beltECBStart(state, beltH() + 128 + 32, 32);
	beltECBStepD(buf, 16, state);
	if (!hexEq(buf,
		"0DC5300600CAB840B38448E5E993F421"))
		return ERR_SELFTEST;
	// belt-mac: тест A.17-1
	ASSERT(sizeof(state) >= beltMAC_keep());
	beltMAC(buf, beltH(), 13, beltH() + 128, 32);
	if (!hexEq(buf, "7260DA60138F96C9"))
		return ERR_SELFTEST;
	// pbkdf2 тест E.5
	beltPBKDF2(buf, (const octet*)pwd, strLen(pwd), 10000,
		beltH() + 128 + 64, 8);
	if (!hexEq(buf,
		"3D331BBBB1FBBB40E4BF22F6CB9A689E"
		"F13A77DC09ECF93291BFE42439A72E7D"))
		return ERR_SELFTEST;
	// belt-che: тест A.19-2
	ASSERT(sizeof(state) >= beltCHE_keep());
	beltCHEStart(state, beltH() + 128, 32, beltH() + 192);
	memCopy(buf, beltH(), 15);
	beltCHEStepE(buf, 15, state);
	beltCHEStepI(beltH() + 16, 32, state);
	beltCHEStepA(buf, 15, state);
	beltCHEStepG(buf1, state);
	if (!hexEq(buf,
		"BF3DAEAF5D18D2BCC30EA62D2E70A4"))
		return ERR_SELFTEST;
	if (!hexEq(buf1,
		"548622B844123FF7"))
		return ERR_SELFTEST;
	if (!beltCHEStepV(buf1, state))
		return ERR_SELFTEST;
	// belt-che: тест A.20-2
	beltCHEStart(state, beltH() + 128 + 32, 32, beltH() + 192 + 16);
	memCopy(buf, beltH() + 64, 20);
	beltCHEStepI(beltH() + 64 + 16, 32, state);
	beltCHEStepA(buf, 20, state);
	beltCHEStepD(buf, 20, state);
	beltCHEStepG(buf1, state);
	if (!hexEq(buf,
		"2BABF43EB37B5398A9068F31A3C758B762F44AA9"))
		return ERR_SELFTEST;
	if (!hexEq(buf1,
		"7D9D4F59D40D197D"))
		return ERR_SELFTEST;
	// belt-kwp: тест A.21
	ASSERT(sizeof(state) >= beltKWP_keep());
	beltKWPStart(state, beltH() + 128, 32);
	memCopy(buf, beltH(), 32);
	memCopy(buf + 32, beltH() + 32, 16);
	beltKWPStepE(buf, 48, state);
	if (!hexEq(buf,
		"49A38EE108D6C742E52B774F00A6EF98"
		"B106CBD13EA4FB0680323051BC04DF76"
		"E487B055C69BCF541176169F1DC9F6C8"))
		return ERR_SELFTEST;
	// belt-kwp: тест A.22
	beltKWPStart(state, beltH() + 128 + 32, 32);
	memCopy(buf, beltH() + 64, 48);
	beltKWPStepD(buf, 48, state);
	if (!hexEq(buf,
		"92632EE0C21AD9E09A39343E5C07DAA4"
		"889B03F2E6847EB152EC99F7A4D9F154"))
		return ERR_SELFTEST;
	if (!hexEq(buf + 32,
		"B5EF68D8E4A39E567153DE13D72254EE"))
		return ERR_SELFTEST;
	// belt-hash: тест A.23-1
	beltHashStart(state);
	beltHashStepH(beltH(), 13, state);
	beltHashStepG(buf1, state);
	if (!hexEq(buf1,
		"ABEF9725D4C5A83597A367D14494CC25"
		"42F20F659DDFECC961A3EC550CBA8C75"))
		return ERR_SELFTEST;
	return ERR_OK;
}